

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O3

int csp_id_strip(csp_packet_t *packet)

{
  ushort uVar1;
  uint uVar2;
  uint6 *puVar3;
  uint6 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  (packet->field_0).field_0.timestamp_rx = 0;
  uVar1 = (packet->field_0).field_1.frame_length;
  if (csp_conf.version == '\x02') {
    if (uVar1 < 6) {
      return -1;
    }
    puVar3 = (uint6 *)(packet->field_0).field_1.frame_begin;
    uVar4 = *puVar3;
    uVar6 = (ulong)*(ushort *)((long)puVar3 + 4) << 0x20;
    uVar7 = (ulong)uVar4;
    packet->length = uVar1 - 6;
    uVar6 = (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8;
    uVar7 = uVar6 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    (packet->id).pri = (byte)uVar4 >> 6;
    (packet->id).dst = (ushort)(uVar7 >> 0x30) & 0x3fff;
    (packet->id).src = (ushort)(uint)(uVar7 >> 0x22) & 0x3fff;
    (packet->id).dport = (byte)(uVar7 >> 0x1c) & 0x3f;
    (packet->id).sport = (byte)((uint)uVar6 >> 0x16) & 0x3f;
    uVar5 = (uint)(uVar6 >> 0x10) & 0xff3f;
  }
  else {
    if (uVar1 < 4) {
      return -1;
    }
    uVar2 = *(uint *)(packet->field_0).field_1.frame_begin;
    packet->length = uVar1 - 4;
    uVar5 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    (packet->id).pri = (byte)uVar2 >> 6;
    uVar1 = (ushort)(uVar5 >> 0x10);
    (packet->id).dst = uVar1 >> 4 & 0x1f;
    (packet->id).src = uVar1 >> 9 & 0x1f;
    (packet->id).dport = (byte)(uVar5 >> 0xe) & 0x3f;
    (packet->id).sport = (byte)((uVar2 & 0xff0000) >> 0x10) & 0x3f;
  }
  (packet->id).flags = (uint8_t)uVar5;
  return 0;
}

Assistant:

int csp_id_strip(csp_packet_t * packet) {
	packet->timestamp_rx = 0;
	if (csp_conf.version == 2) {
		return csp_id2_strip(packet);
	} else {
		return csp_id1_strip(packet);
	}
}